

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O2

void __thiscall unixsocketipc::MessageReceiver::~MessageReceiver(MessageReceiver *this)

{
  this->_vptr_MessageReceiver = (_func_int **)&PTR__MessageReceiver_00104da8;
  if (this->server_socket_fd != 0) {
    close(this->server_socket_fd);
  }
  unlink((this->socket_filename)._M_dataplus._M_p);
  if (this->message_buf != (char *)0x0) {
    operator_delete__(this->message_buf);
  }
  this->message_buf = (char *)0x0;
  std::__cxx11::string::~string((string *)&this->socket_filename);
  std::_Function_base::~_Function_base(&(this->on_client_connected).super__Function_base);
  std::_Function_base::~_Function_base(&(this->callback).super__Function_base);
  return;
}

Assistant:

MessageReceiver::~MessageReceiver() {
   // close the socket
   if (server_socket_fd)
      ::close(server_socket_fd);

   // remove socket file
   unlink(socket_filename.c_str());

   // get rid of the buffer
   delete[] message_buf;
   message_buf = nullptr;
}